

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O3

bool __thiscall FIX::Initiator::isLoggedOn(Initiator *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  Session *pSVar3;
  _Base_ptr p_Var4;
  byte bVar5;
  SessionIDs connected;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  _Stack_58;
  
  Mutex::lock(&this->m_mutex);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&_Stack_58,&(this->m_connected)._M_t);
  p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
  p_Var4 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)_Stack_58._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    bVar5 = 0;
  }
  else {
    do {
      pSVar3 = Session::lookupSession((SessionID *)(p_Var4 + 1));
      bVar5 = (pSVar3->m_state).m_sentLogon & (pSVar3->m_state).m_receivedLogon;
      if (bVar5 != 0) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&_Stack_58);
  iVar2 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar2 + -1;
  if (iVar2 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return (bool)bVar5;
}

Assistant:

bool Initiator::isLoggedOn() const {
  Locker l(m_mutex);

  SessionIDs connected = m_connected;
  SessionIDs::iterator i = connected.begin();
  for (; i != connected.end(); ++i) {
    if (Session::lookupSession(*i)->isLoggedOn()) {
      return true;
    }
  }
  return false;
}